

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O3

void __thiscall xatlas::internal::segment::Atlas::resetCharts(Atlas *this)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  uint8_t *puVar3;
  Chart *chart;
  ulong uVar4;
  char *__function;
  ulong uVar5;
  
  uVar5 = (ulong)(this->m_mesh->m_indices).m_base.size;
  uVar4 = uVar5 / 3;
  if (2 < uVar5) {
    puVar3 = (this->m_faceCharts).m_base.buffer;
    uVar5 = 0;
    do {
      if ((this->m_faceCharts).m_base.size <= uVar5) {
        __function = "T &xatlas::internal::Array<int>::operator[](uint32_t) [T = int]";
        goto LAB_001ae206;
      }
      puVar1 = puVar3 + uVar5 * 4;
      puVar1[0] = 0xff;
      puVar1[1] = 0xff;
      puVar1[2] = 0xff;
      puVar1[3] = 0xff;
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  this->m_facesLeft = (uint32_t)uVar4;
  uVar4 = (ulong)(this->m_charts).m_base.size;
  if (uVar4 != 0) {
    uVar5 = 0;
    do {
      if ((this->m_charts).m_base.size <= uVar5) {
        __function = 
        "T &xatlas::internal::Array<xatlas::internal::segment::Chart *>::operator[](uint32_t) [T = xatlas::internal::segment::Chart *]"
        ;
LAB_001ae206:
        __assert_fail("index < m_base.size",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                      ,0x4ae,__function);
      }
      chart = *(Chart **)((this->m_charts).m_base.buffer + uVar5 * 8);
      uVar2 = (chart->seeds).m_base.size;
      if (uVar2 == 0) {
        __assert_fail("!isEmpty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                      ,0x4b4,
                      "const T &xatlas::internal::Array<unsigned int>::back() const [T = unsigned int]"
                     );
      }
      uVar2 = *(uint32_t *)((chart->seeds).m_base.buffer + (ulong)(uVar2 - 1) * 4);
      (chart->faces).m_base.size = 0;
      (chart->candidates).m_pairs.m_base.size = 0;
      (chart->failedPlanarRegions).m_base.size = 0;
      (chart->basis).tangent.x = 0.0;
      (chart->basis).tangent.y = 0.0;
      *(undefined8 *)&(chart->basis).tangent.z = 0;
      (chart->basis).bitangent.y = 0.0;
      (chart->basis).bitangent.z = 0.0;
      (chart->basis).normal.x = 0.0;
      (chart->basis).normal.y = 0.0;
      *(undefined8 *)&(chart->basis).normal.z = 0;
      chart->boundaryLength = 0.0;
      (chart->centroidSum).x = 0.0;
      (chart->centroidSum).y = 0.0;
      (chart->centroidSum).z = 0.0;
      (chart->centroid).x = 0.0;
      (chart->centroid).y = 0.0;
      (chart->centroid).z = 0.0;
      addFaceToChart(this,chart,uVar2);
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  return;
}

Assistant:

void resetCharts()
	{
		XA_PROFILE_START(buildAtlasResetCharts)
		const uint32_t faceCount = m_mesh->faceCount();
		for (uint32_t i = 0; i < faceCount; i++)
			m_faceCharts[i] = -1;
		m_facesLeft = faceCount;
		const uint32_t chartCount = m_charts.size();
		for (uint32_t i = 0; i < chartCount; i++) {
			Chart *chart = m_charts[i];
			const uint32_t seed = chart->seeds.back();
			chart->area = 0.0f;
			chart->boundaryLength = 0.0f;
			chart->basis.normal = Vector3(0.0f);
			chart->basis.tangent = Vector3(0.0f);
			chart->basis.bitangent = Vector3(0.0f);
			chart->centroidSum = Vector3(0.0f);
			chart->centroid = Vector3(0.0f);
			chart->faces.clear();
			chart->candidates.clear();
			chart->failedPlanarRegions.clear();
			addFaceToChart(chart, seed);
		}
		XA_PROFILE_END(buildAtlasResetCharts)
	}